

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_misc.cpp
# Opt level: O0

long ParseCommandLine(char *args,int *argc,char **argv)

{
  int *piVar1;
  bool bVar2;
  char *end;
  char *start;
  char *pcStack_30;
  char stuff;
  char *buffplace;
  int count;
  char **argv_local;
  int *argc_local;
  char *args_local;
  
  buffplace._4_4_ = 0;
  pcStack_30 = (char *)0x0;
  argc_local = (int *)args;
  if (argv != (char **)0x0) {
    pcStack_30 = *argv;
  }
  while( true ) {
    while( true ) {
      piVar1 = argc_local;
      bVar2 = false;
      if ((char)*argc_local < '!') {
        bVar2 = (char)*argc_local != '\0';
      }
      if (!bVar2) break;
      argc_local = (int *)((long)argc_local + 1);
    }
    if ((char)*argc_local == '\0') break;
    if ((char)*argc_local == '\"') {
      if (argv != (char **)0x0) {
        argv[buffplace._4_4_] = pcStack_30;
      }
      argc_local = (int *)((long)argc_local + 1);
      do {
        piVar1 = (int *)((long)argc_local + 1);
        start._7_1_ = (char)*argc_local;
        if ((start._7_1_ == '\\') && (*(char *)piVar1 == '\"')) {
          start._7_1_ = '\"';
          piVar1 = (int *)((long)argc_local + 2);
        }
        else if (start._7_1_ == '\"') {
          start._7_1_ = '\0';
        }
        else if (start._7_1_ == '\0') {
          piVar1 = argc_local;
        }
        argc_local = piVar1;
        if (argv != (char **)0x0) {
          *pcStack_30 = start._7_1_;
        }
        pcStack_30 = pcStack_30 + 1;
      } while (start._7_1_ != '\0');
    }
    else {
      end = (char *)argc_local;
      do {
        argc_local = (int *)((long)argc_local + 1);
        bVar2 = false;
        if ((*(char *)argc_local != '\0') && (bVar2 = false, ' ' < *(char *)argc_local)) {
          bVar2 = *(char *)argc_local != '\"';
        }
      } while (bVar2);
      if (argv == (char **)0x0) {
        pcStack_30 = pcStack_30 + (long)argc_local + (1 - (long)piVar1);
      }
      else {
        argv[buffplace._4_4_] = pcStack_30;
        while (end < argc_local) {
          *pcStack_30 = *end;
          end = end + 1;
          pcStack_30 = pcStack_30 + 1;
        }
        *pcStack_30 = '\0';
        pcStack_30 = pcStack_30 + 1;
      }
    }
    buffplace._4_4_ = buffplace._4_4_ + 1;
  }
  if (argc != (int *)0x0) {
    *argc = buffplace._4_4_;
  }
  return (long)pcStack_30;
}

Assistant:

static long ParseCommandLine (const char *args, int *argc, char **argv)
{
	int count;
	char *buffplace;

	count = 0;
	buffplace = NULL;
	if (argv != NULL)
	{
		buffplace = argv[0];
	}

	for (;;)
	{
		while (*args <= ' ' && *args)
		{ // skip white space
			args++;
		}
		if (*args == 0)
		{
			break;
		}
		else if (*args == '\"')
		{ // read quoted string
			char stuff;
			if (argv != NULL)
			{
				argv[count] = buffplace;
			}
			count++;
			args++;
			do
			{
				stuff = *args++;
				if (stuff == '\\' && *args == '\"')
				{
					stuff = '\"', args++;
				}
				else if (stuff == '\"')
				{
					stuff = 0;
				}
				else if (stuff == 0)
				{
					args--;
				}
				if (argv != NULL)
				{
					*buffplace = stuff;
				}
				buffplace++;
			} while (stuff);
		}
		else
		{ // read unquoted string
			const char *start = args++, *end;

			while (*args && *args > ' ' && *args != '\"')
				args++;
			end = args;
			if (argv != NULL)
			{
				argv[count] = buffplace;
				while (start < end)
					*buffplace++ = *start++;
				*buffplace++ = 0;
			}
			else
			{
				buffplace += end - start + 1;
			}
			count++;
		}
	}
	if (argc != NULL)
	{
		*argc = count;
	}
	return (long)(buffplace - (char *)0);
}